

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOverwritesExisting<phmap::node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>_>
::TestBody(AssignmentOverwritesExisting<phmap::node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>_>
           *this)

{
  Generator<phmap::priv::hash_internal::Enum,_void> *this_00;
  initializer_list<phmap::priv::hash_internal::Enum> iVar1;
  initializer_list<phmap::priv::hash_internal::Enum> iVar2;
  bool bVar3;
  char *message;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_118;
  StatefulTestingHash local_110;
  Enum local_104;
  iterator local_100;
  size_type local_f8;
  undefined1 local_f0 [8];
  TypeParam n;
  Alloc<phmap::priv::hash_internal::Enum> local_98;
  StatefulTestingEqual local_90;
  StatefulTestingHash local_88;
  Enum local_7c;
  Enum local_78;
  Enum local_74;
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  TypeParam m;
  Generator<phmap::priv::hash_internal::Enum,_void> gen;
  AssignmentOverwritesExisting<phmap::node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>_>
  *this_local;
  
  this_00 = (Generator<phmap::priv::hash_internal::Enum,_void> *)
            ((long)&m.
                    super_raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    .settings_.
                    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 7);
  local_7c = hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  local_78 = hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  local_74 = hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()(this_00);
  local_70 = &local_7c;
  local_68 = 3;
  local_88.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_88);
  local_90.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_90);
  Alloc<phmap::priv::hash_internal::Enum>::Alloc(&local_98,0);
  iVar2._M_len = local_68;
  iVar2._M_array = local_70;
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::raw_hash_set((node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                  *)local_60,iVar2,0,&local_88,&local_90,&local_98);
  Alloc<phmap::priv::hash_internal::Enum>::~Alloc(&local_98);
  local_104 = hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()
                        ((Generator<phmap::priv::hash_internal::Enum,_void> *)
                         ((long)&m.
                                 super_raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                                 .settings_.
                                 super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                                 .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + 7));
  local_100 = &local_104;
  local_f8 = 1;
  local_110.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_110);
  local_118.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_118);
  Alloc<phmap::priv::hash_internal::Enum>::Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)&gtest_ar.message_,0);
  iVar1._M_len = local_f8;
  iVar1._M_array = local_100;
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::raw_hash_set((node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                  *)local_f0,iVar1,0,&local_110,&local_118,(allocator_type *)&gtest_ar.message_);
  Alloc<phmap::priv::hash_internal::Enum>::~Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)&gtest_ar.message_);
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::operator=((node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
               *)local_f0,
              (node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
               *)local_60);
  testing::internal::EqHelper::
  Compare<phmap::node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>,_phmap::node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>,_nullptr>
            ((EqHelper *)local_130,"m","n",
             (node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              *)local_60,
             (node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              *)local_f0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar3) {
    testing::Message::Message(&local_138);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1c0,message);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~node_hash_set((node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    *)local_f0);
  node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::~node_hash_set((node_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                    *)local_60);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  TypeParam m({gen(), gen(), gen()});
  TypeParam n({gen()});
  n = m;
  EXPECT_EQ(m, n);
}